

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_duplicates_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::RemoveDuplicatesPass::RemoveDuplicatesExtInstImports(RemoveDuplicatesPass *this)

{
  bool bVar1;
  uint32_t before;
  Operand *this_00;
  IRContext *pIVar2;
  pointer ppVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar4;
  uint32_t local_ac;
  string local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_88;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  res;
  Instruction *local_70;
  Instruction *i;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ext_inst_imports;
  bool local_19;
  bool modified;
  RemoveDuplicatesPass *this_local;
  
  local_19 = false;
  Pass::context(&this->super_Pass);
  IRContext::ext_inst_imports((IRContext *)&ext_inst_imports._M_h._M_single_bucket);
  bVar1 = IteratorRange<spvtools::opt::InstructionList::iterator>::empty
                    ((IteratorRange<spvtools::opt::InstructionList::iterator> *)
                     &ext_inst_imports._M_h._M_single_bucket);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)&i);
    Pass::context(&this->super_Pass);
    IRContext::ext_inst_import_begin((IRContext *)&res.second);
    local_70 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&res.second);
    while (local_70 != (Instruction *)0x0) {
      this_00 = opt::Instruction::GetInOperand(local_70,0);
      Operand::AsString_abi_cxx11_(&local_a8,this_00);
      local_ac = opt::Instruction::result_id(local_70);
      pVar4 = std::
              unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              ::emplace<std::__cxx11::string,unsigned_int>
                        ((unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                          *)&i,&local_a8,&local_ac);
      local_88._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
           ._M_cur;
      res.first.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur._0_1_ = pVar4.second;
      std::__cxx11::string::~string((string *)&local_a8);
      if (((byte)res.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                 ._M_cur & 1) == 0) {
        pIVar2 = Pass::context(&this->super_Pass);
        before = opt::Instruction::result_id(local_70);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                               *)&local_88);
        IRContext::ReplaceAllUsesWith(pIVar2,before,ppVar3->second);
        pIVar2 = Pass::context(&this->super_Pass);
        local_70 = IRContext::KillInst(pIVar2,local_70);
        local_19 = true;
      }
      else {
        local_70 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                             (&local_70->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      }
    }
    this_local._7_1_ = local_19;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&i);
  }
  return this_local._7_1_;
}

Assistant:

bool RemoveDuplicatesPass::RemoveDuplicatesExtInstImports() const {
  bool modified = false;

  if (context()->ext_inst_imports().empty()) {
    return modified;
  }

  std::unordered_map<std::string, spv::Id> ext_inst_imports;
  for (auto* i = &*context()->ext_inst_import_begin(); i;) {
    auto res = ext_inst_imports.emplace(i->GetInOperand(0u).AsString(),
                                        i->result_id());
    if (res.second) {
      // Never seen before, keep it.
      i = i->NextNode();
    } else {
      // It's a duplicate, remove it.
      context()->ReplaceAllUsesWith(i->result_id(), res.first->second);
      i = context()->KillInst(i);
      modified = true;
    }
  }

  return modified;
}